

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Atom_p __thiscall indigox::Molecule::GetAtomUniqueID(Molecule *this,uid_t i)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<indigox::Atom> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  Atom_p AVar3;
  iterator __end1;
  iterator __begin1;
  MolAtoms *__range1;
  Atom_p *atm;
  vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
  *in_stack_ffffffffffffff98;
  shared_ptr<indigox::Atom> *in_stack_ffffffffffffffa0;
  __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  local_28;
  long local_20;
  shared_ptr<indigox::Atom> *local_18;
  
  local_20 = in_RSI + 0x40;
  local_18 = in_RDX;
  local_28._M_current =
       (shared_ptr<indigox::Atom> *)
       std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
       ::begin(in_stack_ffffffffffffff98);
  std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::end
            (in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
    ::operator*(&local_28);
    std::shared_ptr<indigox::Atom>::shared_ptr
              (in_stack_ffffffffffffffa0,(shared_ptr<indigox::Atom> *)in_stack_ffffffffffffff98);
    this_00 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x10f88a);
    in_stack_ffffffffffffffa0 =
         (shared_ptr<indigox::Atom> *)
         utils::CountableObject<indigox::Atom>::GetUniqueID
                   (&this_00->super_CountableObject<indigox::Atom>);
    _Var2._M_pi = extraout_RDX;
    if (in_stack_ffffffffffffffa0 == local_18) goto LAB_0010f90e;
    std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x10f8e7);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
    ::operator++(&local_28);
  }
  std::shared_ptr<indigox::Atom>::shared_ptr((shared_ptr<indigox::Atom> *)0x10f90e);
  _Var2._M_pi = extraout_RDX_00;
LAB_0010f90e:
  AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Atom_p)AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::GetAtomUniqueID(uid_t i) {
  for (Atom_p atm : atoms_) {
    if (atm->GetUniqueID() == i) return atm;
  }
  return Atom_p();
}